

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRDatum.h
# Opt level: O0

VRString * __thiscall MinVR::VRDatumString::getValueString_abi_cxx11_(VRDatumString *this)

{
  const_reference pvVar1;
  VRString *in_RDI;
  VRString *this_00;
  
  this_00 = in_RDI;
  pvVar1 = std::__cxx11::
           list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::front((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)in_RDI);
  std::__cxx11::string::string((string *)this_00,(string *)pvVar1);
  return in_RDI;
}

Assistant:

const VRString* getPointerString() const { return &(value.front()); }